

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O2

Error __thiscall
asmjit::BaseEmitter::_emitOpArray
          (BaseEmitter *this,uint32_t instId,Operand_ *operands,size_t opCount)

{
  Error EVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  
  switch(opCount) {
  case 0:
    UNRECOVERED_JUMPTABLE = this->_vptr_BaseEmitter[7];
    break;
  case 1:
    UNRECOVERED_JUMPTABLE = this->_vptr_BaseEmitter[7];
    break;
  case 2:
    UNRECOVERED_JUMPTABLE = this->_vptr_BaseEmitter[7];
    break;
  case 3:
    UNRECOVERED_JUMPTABLE = this->_vptr_BaseEmitter[7];
    break;
  case 4:
    goto LAB_00113967;
  case 5:
LAB_00113967:
    EVar1 = (*this->_vptr_BaseEmitter[7])();
    return EVar1;
  case 6:
    UNRECOVERED_JUMPTABLE = this->_vptr_BaseEmitter[7];
    break;
  default:
    return 2;
  }
  EVar1 = (*UNRECOVERED_JUMPTABLE)();
  return EVar1;
}

Assistant:

Error BaseEmitter::_emitOpArray(uint32_t instId, const Operand_* operands, size_t opCount) {
  const Operand_* op = operands;

  Operand_ opExt[3];

  switch (opCount) {
    case 0:
      return _emit(instId, noExt[0], noExt[1], noExt[2], noExt);

    case 1:
      return _emit(instId, op[0], noExt[1], noExt[2], noExt);

    case 2:
      return _emit(instId, op[0], op[1], noExt[2], noExt);

    case 3:
      return _emit(instId, op[0], op[1], op[2], noExt);

    case 4:
      opExt[0] = op[3];
      opExt[1].reset();
      opExt[2].reset();
      return _emit(instId, op[0], op[1], op[2], opExt);

    case 5:
      opExt[0] = op[3];
      opExt[1] = op[4];
      opExt[2].reset();
      return _emit(instId, op[0], op[1], op[2], opExt);

    case 6:
      return _emit(instId, op[0], op[1], op[2], op + 3);

    default:
      return DebugUtils::errored(kErrorInvalidArgument);
  }
}